

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_data.cpp
# Opt level: O1

void __thiscall
test_csr_data_insert_Test::~test_csr_data_insert_Test(test_csr_data_insert_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_csr_data, insert) {
  CSR_Data<Scalar> data;
  resize(data, 5, 5);

  // death tests
  EXPECT_DEATH(insert(data, -1, 1, 1.0), ".*");
  EXPECT_DEATH(insert(data, 1, -1, 1.0), ".*");

  // add A[3][2] = 1.0
  auto [iter, is_insert] = insert(data, 3, 2, 1.0);
  auto [iter_row, iter_column, iter_value] = iter;
  EXPECT_TRUE(is_insert);
  EXPECT_EQ(size_row(data), 5);
  EXPECT_EQ(size_column(data), 5);
  EXPECT_EQ(size_non_zero(data), 1);
  EXPECT_EQ(*iter_row, 0);  // together with size_non_zero implicitly checks correct update of offsets.
  EXPECT_EQ(i_row(data, iter_row), 3);
  EXPECT_EQ(*iter_column, 2);
  EXPECT_EQ(*iter_value, 1.0);

  // add A[3][1] = 3.0 - we insert out of order - will check order at the end.
  std::tie(iter, is_insert) = insert(data, 3, 1, 3.0);
  std::tie(iter_row, iter_column, iter_value) = iter;
  EXPECT_TRUE(is_insert);
  EXPECT_EQ(size_row(data), 5);
  EXPECT_EQ(size_column(data), 5);
  EXPECT_EQ(size_non_zero(data), 2);
  EXPECT_EQ(*iter_row, 0);
  EXPECT_EQ(i_row(data, iter_row), 3);
  EXPECT_EQ(*iter_column, 1);
  EXPECT_EQ(*iter_value, 3.0);

  // add A[2][1] = 4.0 - Previous row test
  std::tie(iter, is_insert) = insert(data, 2, 1, 4.0);
  std::tie(iter_row, iter_column, iter_value) = iter;
  EXPECT_TRUE(is_insert);
  EXPECT_EQ(size_row(data), 5);
  EXPECT_EQ(size_column(data), 5);
  EXPECT_EQ(size_non_zero(data), 3);
  EXPECT_EQ(*iter_row, 0);
  EXPECT_EQ(i_row(data, iter_row), 2);
  EXPECT_EQ(*iter_column, 1);
  EXPECT_EQ(*iter_value, 4.0);

  // add A[2][4] = 4.0 - last of columns test
  std::tie(iter, is_insert) = insert(data, 2, 4, 5.0);
  std::tie(iter_row, iter_column, iter_value) = iter;
  EXPECT_TRUE(is_insert);
  EXPECT_EQ(size_row(data), 5);
  EXPECT_EQ(size_column(data), 5);
  EXPECT_EQ(size_non_zero(data), 4);
  EXPECT_EQ(*iter_row, 0);
  EXPECT_EQ(i_row(data, iter_row), 2);
  EXPECT_EQ(*iter_column, 4);
  EXPECT_EQ(*iter_value, 5.0);

  // add A[4][0] = 8.0 - last of rows test
  std::tie(iter, is_insert) = insert(data, 4, 0, 8.0);
  std::tie(iter_row, iter_column, iter_value) = iter;
  EXPECT_TRUE(is_insert);
  EXPECT_EQ(size_row(data), 5);
  EXPECT_EQ(size_column(data), 5);
  EXPECT_EQ(size_non_zero(data), 5);
  EXPECT_EQ(*iter_row, 4);
  EXPECT_EQ(i_row(data, iter_row), 4);
  EXPECT_EQ(*iter_column, 0);
  EXPECT_EQ(*iter_value, 8.0);

  // add A[4][4] = -5.0 - last row and column test
  std::tie(iter, is_insert) = insert(data, 4, 4, -5.0);
  std::tie(iter_row, iter_column, iter_value) = iter;
  EXPECT_TRUE(is_insert);
  EXPECT_EQ(size_row(data), 5);
  EXPECT_EQ(size_column(data), 5);
  EXPECT_EQ(size_non_zero(data), 6);
  EXPECT_EQ(*iter_row, 4);
  EXPECT_EQ(i_row(data, iter_row), 4);
  EXPECT_EQ(*iter_column, 4);
  EXPECT_EQ(*iter_value, -5.0);

  // try add A[3][2] = -5.0 (blocked) - no insert test
  std::tie(iter, is_insert) = insert(data, 3, 2, -5.0);
  std::tie(iter_row, iter_column, iter_value) = iter;
  EXPECT_FALSE(is_insert);
  EXPECT_EQ(size_row(data), 5);
  EXPECT_EQ(size_column(data), 5);
  EXPECT_EQ(size_non_zero(data), 6);
  EXPECT_EQ(*iter_row, 2);
  EXPECT_EQ(i_row(data, iter_row), 3);
  EXPECT_EQ(*iter_column, 2);
  EXPECT_EQ(*iter_value, 1.0);  // previous insert

  // add A[6][2] = 10.0 - new 'key' insert by adding an extra row.
  std::tie(iter, is_insert) = insert(data, 6, 2, 10.0);
  std::tie(iter_row, iter_column, iter_value) = iter;
  EXPECT_TRUE(is_insert);
  EXPECT_EQ(size_row(data), 7);
  EXPECT_EQ(size_column(data), 5);
  EXPECT_EQ(size_non_zero(data), 7);
  EXPECT_EQ(*iter_row, 6);
  EXPECT_EQ(i_row(data, iter_row), 6);
  EXPECT_EQ(*iter_column, 2);
  EXPECT_EQ(*iter_value, 10.0);

  // add A[6][2] = 10.0 - new 'key' insert by adding an extra column.
  std::tie(iter, is_insert) = insert(data, 2, 6, 50.0);
  std::tie(iter_row, iter_column, iter_value) = iter;
  EXPECT_TRUE(is_insert);
  EXPECT_EQ(size_row(data), 7);
  EXPECT_EQ(size_column(data), 7);
  EXPECT_EQ(size_non_zero(data), 8);
  EXPECT_EQ(*iter_row, 0);
  EXPECT_EQ(i_row(data, iter_row), 2);
  EXPECT_EQ(*iter_column, 6);
  EXPECT_EQ(*iter_value, 50.0);

  // Check data structure integrity before.
  iter_row = data.row_offset.begin();
  iter_column = data.i_column.begin();
  iter_value = data.value.begin();
  for(auto check_value : std::vector<CSR_Data<Scalar>::index_type>({0, 0, 0, 3, 5, 7, 7, 8}))
    EXPECT_EQ(*iter_row++, check_value);
  for(auto check_value : std::vector<CSR_Data<Scalar>::index_type>({1, 4, 6, 1, 2, 0, 4, 2}))
    EXPECT_EQ(*iter_column++, check_value);
  for(auto check_value : std::vector<CSR_Data<Scalar>::value_type>({4.0, 5.0, 50.0, 3.0, 1.0, 8.0, -5.0, 10.0}))
    EXPECT_EQ(*iter_value++, check_value);
  EXPECT_EQ(data.columns, 7);
}